

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linearizer.c
# Opt level: O3

void linearize_store_var(Proc *proc,VariableType *var_type,Pseudo *var_pseudo,VariableType *val_type
                        ,Pseudo *val_pseudo,uint line_number)

{
  uint uVar1;
  Pseudo *pPVar2;
  Pseudo *ptr;
  C_MemoryAllocator *pCVar3;
  char cVar4;
  ravitype_t rVar5;
  undefined1 *ptr_00;
  byte *ptr_01;
  Pseudo *pseudo;
  ravitype_t rVar6;
  opcode op;
  ravitype_t rVar7;
  byte bVar8;
  
  if (((undefined1  [48])*var_pseudo & (undefined1  [48])0xf) == (undefined1  [48])0xe) {
    if ((undefined1  [40])((undefined1  [40])var_pseudo->field_3 & (undefined1  [40])0x100000000) ==
        (undefined1  [40])0x0) {
      uVar1 = (var_pseudo->field_3).range_in_use;
      if (uVar1 == 0x40) {
        bVar8 = val_type->type_code == RAVI_TNUMFLT | 0x46;
      }
      else if (uVar1 == 0x20) {
        bVar8 = val_type->type_code == RAVI_TNUMINT | 0x44;
      }
      else {
        rVar5 = (var_pseudo->field_3).index_info.key_type;
        cVar4 = (uVar1 == 0x80) * '\x03';
        bVar8 = cVar4 + 0x3e;
        if (rVar5 == RAVI_TSTRING) {
          bVar8 = cVar4 + 0x40;
        }
        else if (rVar5 == RAVI_TNUMINT) {
          bVar8 = cVar4 + 0x3f;
        }
      }
      pPVar2 = (var_pseudo->field_3).index_info.container;
      if (((undefined1  [48])*pPVar2 & (undefined1  [48])0xf) == (undefined1  [48])0xe) {
        __assert_fail("container_pseudo->type != PSEUDO_INDEXED",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/linearizer.c"
                      ,0x5b4,"void indexed_store(Proc *, Pseudo *, Pseudo *, ravitype_t)");
      }
      ptr = (var_pseudo->field_3).index_info.key;
      if (((undefined1  [48])*ptr & (undefined1  [48])0xf) == (undefined1  [48])0xe) {
        __assert_fail("key_pseudo->type != PSEUDO_INDEXED",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/linearizer.c"
                      ,0x5b5,"void indexed_store(Proc *, Pseudo *, Pseudo *, ravitype_t)");
      }
      uVar1 = (var_pseudo->field_3).index_info.line_number;
      pCVar3 = proc->linearizer->compiler_state->allocator;
      ptr_01 = (byte *)(*pCVar3->calloc)(pCVar3->arena,1,0x28);
      *ptr_01 = bVar8;
      *(uint *)(ptr_01 + 0x20) = uVar1;
      if (((undefined1  [48])*val_pseudo & (undefined1  [48])0xf) == (undefined1  [48])0xe) {
        pseudo = indexed_load(proc,val_pseudo);
        val_pseudo = pseudo;
      }
      else {
        pseudo = (Pseudo *)0x0;
      }
      raviX_ptrlist_add((PtrList **)(ptr_01 + 8),val_pseudo,
                        proc->linearizer->compiler_state->allocator);
      if (((undefined1  [48])*pPVar2 & (undefined1  [48])0xf) != (undefined1  [48])0xe) {
        raviX_ptrlist_add((PtrList **)(ptr_01 + 0x10),pPVar2,
                          proc->linearizer->compiler_state->allocator);
        if (((undefined1  [48])*ptr & (undefined1  [48])0xf) != (undefined1  [48])0xe) {
          raviX_ptrlist_add((PtrList **)(ptr_01 + 0x10),ptr,
                            proc->linearizer->compiler_state->allocator);
          if (*(BasicBlock **)(ptr_01 + 0x18) != proc->current_bb &&
              *(BasicBlock **)(ptr_01 + 0x18) != (BasicBlock *)0x0) {
LAB_0011c879:
            __assert_fail("insn->block == NULL || insn->block == proc->current_bb",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/linearizer.c"
                          ,0x1b1,"void add_instruction(Proc *, Instruction *)");
          }
          raviX_ptrlist_add((PtrList **)&proc->current_bb->insns,ptr_01,
                            proc->linearizer->compiler_state->allocator);
          *(BasicBlock **)(ptr_01 + 0x18) = proc->current_bb;
LAB_0011c80c:
          if (pseudo == (Pseudo *)0x0) {
            return;
          }
          free_temp_pseudo(proc,pseudo,false);
          return;
        }
      }
    }
    else {
      uVar1 = (var_pseudo->field_3).index_info.line_number;
      pCVar3 = proc->linearizer->compiler_state->allocator;
      ptr_00 = (undefined1 *)(*pCVar3->calloc)(pCVar3->arena,1,0x28);
      *ptr_00 = 0x5a;
      *(uint *)(ptr_00 + 0x20) = uVar1;
      if (((undefined1  [48])*val_pseudo & (undefined1  [48])0xf) == (undefined1  [48])0xe) {
        pseudo = indexed_load(proc,val_pseudo);
        val_pseudo = pseudo;
      }
      else {
        pseudo = (Pseudo *)0x0;
      }
      raviX_ptrlist_add((PtrList **)(ptr_00 + 8),val_pseudo,
                        proc->linearizer->compiler_state->allocator);
      pPVar2 = (var_pseudo->field_3).index_info.container;
      if (((undefined1  [48])*pPVar2 & (undefined1  [48])0xf) != (undefined1  [48])0xe) {
        raviX_ptrlist_add((PtrList **)(ptr_00 + 0x10),pPVar2,
                          proc->linearizer->compiler_state->allocator);
        pPVar2 = (var_pseudo->field_3).index_info.key;
        if (((undefined1  [48])*pPVar2 & (undefined1  [48])0xf) != (undefined1  [48])0xe) {
          raviX_ptrlist_add((PtrList **)(ptr_00 + 0x10),pPVar2,
                            proc->linearizer->compiler_state->allocator);
          if (*(BasicBlock **)(ptr_00 + 0x18) != proc->current_bb &&
              *(BasicBlock **)(ptr_00 + 0x18) != (BasicBlock *)0x0) goto LAB_0011c879;
          raviX_ptrlist_add((PtrList **)&proc->current_bb->insns,ptr_00,
                            proc->linearizer->compiler_state->allocator);
          *(BasicBlock **)(ptr_00 + 0x18) = proc->current_bb;
          goto LAB_0011c80c;
        }
      }
    }
    __assert_fail("pseudo->type != PSEUDO_INDEXED",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/linearizer.c"
                  ,0x193,"void add_instruction_target(Proc *, Instruction *, Pseudo *)");
  }
  rVar5 = var_type->type_code;
  op = op_mov;
  if (rVar5 == RAVI_TANY) goto LAB_0011c6df;
  if ((rVar5 == RAVI_TVARARGS) || (rVar5 == RAVI_TNIL)) {
    __assert_fail("var_type->type_code != RAVI_TVARARGS && var_type->type_code != RAVI_TNIL",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/linearizer.c"
                  ,0x6c9,
                  "void linearize_store_var(Proc *, const VariableType *, Pseudo *, const VariableType *, Pseudo *, unsigned int)"
                 );
  }
  uVar1 = (uint)(rVar5 + ~RAVI_TBOOLEAN) >> 3;
  if (((uint)(uVar1 | rVar5 << 0x1d) < 8) && ((0x8bU >> (uVar1 & 0x1f) & 1) != 0)) {
    rVar7 = val_type->type_code;
LAB_0011c51f:
    if ((rVar7 != rVar5) || (rVar6 = rVar5, val_type->type_name != var_type->type_name)) {
      if (rVar5 == RAVI_TNUMINT) {
        op = op_movfi;
        if (rVar7 == RAVI_TNUMFLT) goto LAB_0011c6df;
      }
      else if ((rVar5 == RAVI_TNUMFLT) && (op = op_movif, rVar7 == RAVI_TNUMINT)) goto LAB_0011c6df;
      instruct_totype(proc,val_pseudo,var_type,line_number);
      rVar5 = var_type->type_code;
      rVar6 = rVar5;
    }
  }
  else {
    rVar7 = val_type->type_code;
    rVar6 = RAVI_TNIL;
    if (rVar7 != RAVI_TNIL) goto LAB_0011c51f;
  }
  if (rVar5 == RAVI_TNUMFLT) {
    op = rVar6 == RAVI_TNUMFLT | op_movif;
  }
  else {
    op = op_mov;
    if (rVar5 == RAVI_TNUMINT) {
      op = (uint)(rVar6 != RAVI_TNUMINT) * 3 + op_movi;
    }
  }
LAB_0011c6df:
  instruct_move(proc,op,var_pseudo,val_pseudo,line_number);
  return;
}

Assistant:

static void linearize_store_var(Proc *proc, const VariableType *var_type, Pseudo *var_pseudo,
				const VariableType *val_type, Pseudo *val_pseudo, unsigned line_number)
{
	if (var_pseudo->type == PSEUDO_INDEXED) {
		indexed_store(proc, var_pseudo, val_pseudo, val_type->type_code);
	}
	else {
		assert(var_type->type_code != RAVI_TVARARGS && var_type->type_code != RAVI_TNIL);
		if (!is_compatible(var_type, val_type)) {
			instruct_totype(proc, val_pseudo, var_type, line_number);
			val_type = var_type; // Because of the type assertion!
		}
		enum opcode op = op_mov;
		if (var_type->type_code == RAVI_TNUMINT) {
			op = val_type->type_code == RAVI_TNUMINT ? op_movi : op_movfi;
		} else if (var_type->type_code == RAVI_TNUMFLT) {
			op = val_type->type_code == RAVI_TNUMFLT ? op_movf : op_movif;
		}
		instruct_move(proc, op, var_pseudo, val_pseudo, line_number);
	}
}